

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Geometry.cpp
# Opt level: O3

void __thiscall TRM::Edge::set_top(Edge *this,Vertex *v)

{
  Vertex *pVVar1;
  Edge *pEVar2;
  Edge **ppEVar3;
  
  pVVar1 = this->top;
  if (this->below_prev == (Edge *)0x0) {
    pEVar2 = this->below_next;
    (pVVar1->edge_below).head = pEVar2;
  }
  else {
    pEVar2 = this->below_next;
    this->below_prev->below_next = pEVar2;
  }
  ppEVar3 = &pEVar2->below_prev;
  if (pEVar2 == (Edge *)0x0) {
    ppEVar3 = &(pVVar1->edge_below).tail;
  }
  *ppEVar3 = this->below_prev;
  this->below_prev = (Edge *)0x0;
  this->below_next = (Edge *)0x0;
  this->top = v;
  recompute(this);
  Vertex::insert_below(this->top,this);
  return;
}

Assistant:

void Edge::set_top(Vertex* v) {
  // remove this edge from top's below list
  LinkedList<Edge>::Remove<&Edge::below_prev, &Edge::below_next>(
      this, &top->edge_below.head, &top->edge_below.tail);
  // update top vertex
  top = v;
  // recompute line equation
  recompute();
  // insert self to new top's below list
  top->insert_below(this);
}